

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

int Nwk_ManGetAigNodeNum(Nwk_Man_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) {
        if (*(Hop_Obj_t **)((long)pvVar1 + 8) == (Hop_Obj_t *)0x0) {
          printf("Nwk_ManGetAigNodeNum(): Local AIG of node %d is not assigned.\n",
                 (ulong)*(uint *)((long)pvVar1 + 0x24));
        }
        else if (1 < *(int *)((long)pvVar1 + 0x3c)) {
          iVar2 = Hop_DagSize(*(Hop_Obj_t **)((long)pvVar1 + 8));
          iVar4 = iVar4 + iVar2;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar4;
}

Assistant:

int Nwk_ManGetAigNodeNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, nNodes = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pFunc == NULL )
        {
            printf( "Nwk_ManGetAigNodeNum(): Local AIG of node %d is not assigned.\n", pNode->Id );
            continue;
        }
        if ( Nwk_ObjFaninNum(pNode) < 2 )
            continue;
        nNodes += Hop_DagSize( pNode->pFunc );
    }
    return nNodes;
}